

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall
QTableViewPrivate::trimHiddenSelections(QTableViewPrivate *this,QItemSelectionRange *range)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QPersistentModelIndexData *pQVar3;
  QPersistentModelIndexData *pQVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int logicalIndex;
  int logicalIndex_00;
  QModelIndex *this_00;
  quintptr *this_01;
  long in_FS_OFFSET;
  QPersistentModelIndexData *local_98;
  QPersistentModelIndexData *apQStack_90 [3];
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = QPersistentModelIndex::row();
  iVar9 = QPersistentModelIndex::column();
  logicalIndex = QPersistentModelIndex::row();
  logicalIndex_00 = QPersistentModelIndex::column();
  bVar7 = logicalIndex < iVar8;
  if ((iVar8 <= logicalIndex) &&
     (bVar5 = QHeaderView::isSectionHidden(this->verticalHeader,logicalIndex), bVar5)) {
    do {
      iVar2 = logicalIndex;
      bVar7 = iVar2 <= iVar8;
      if (iVar2 <= iVar8) break;
      bVar5 = QHeaderView::isSectionHidden(this->verticalHeader,iVar2 + -1);
      logicalIndex = iVar2 + -1;
    } while (bVar5);
    logicalIndex = iVar2 + -1;
  }
  bVar5 = logicalIndex_00 < iVar9;
  if ((iVar9 <= logicalIndex_00) &&
     (bVar6 = QHeaderView::isSectionHidden(this->horizontalHeader,logicalIndex_00), bVar6)) {
    do {
      iVar2 = logicalIndex_00;
      bVar5 = iVar2 <= iVar9;
      if (iVar2 <= iVar9) break;
      bVar6 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar2 + -1);
      logicalIndex_00 = iVar2 + -1;
    } while (bVar6);
    logicalIndex_00 = iVar2 + -1;
  }
  if (bVar7 || bVar5) {
    this_00 = &local_58;
    local_58._0_8_ = (QPersistentModelIndexData *)0x0;
    local_58.i = 0;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_00);
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58.i);
    pQVar3 = (range->tl).d;
    pQVar4 = (range->br).d;
    (range->tl).d = (QPersistentModelIndexData *)local_58._0_8_;
    (range->br).d = (QPersistentModelIndexData *)local_58.i;
    local_58._0_8_ = pQVar3;
    local_58.i = (quintptr)pQVar4;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58.i);
  }
  else {
    do {
      iVar2 = iVar8;
      bVar7 = QHeaderView::isSectionHidden(this->verticalHeader,iVar2);
      if (logicalIndex < iVar2) break;
      iVar8 = iVar2 + 1;
    } while (bVar7);
    do {
      iVar8 = iVar9;
      bVar7 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar8);
      if (logicalIndex_00 < iVar8) break;
      iVar9 = iVar8 + 1;
    } while (bVar7);
    if ((logicalIndex < iVar2) || (logicalIndex_00 < iVar8)) {
      this_00 = &local_58;
      local_58._0_8_ = (QPersistentModelIndexData *)0x0;
      local_58.i = 0;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_00);
      this_01 = &local_58.i;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_01);
      pQVar3 = (range->tl).d;
      pQVar4 = (range->br).d;
      (range->tl).d = (QPersistentModelIndexData *)local_58._0_8_;
      (range->br).d = (QPersistentModelIndexData *)local_58.i;
      local_58._0_8_ = pQVar3;
      local_58.i = (quintptr)pQVar4;
    }
    else {
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::parent();
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,logicalIndex,logicalIndex_00,&local_78)
      ;
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::parent();
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar2,iVar8,(QModelIndex *)&local_98);
      this_00 = (QModelIndex *)&local_98;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_00,&local_78);
      this_01 = (quintptr *)apQStack_90;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_01,&local_58);
      pQVar3 = (range->tl).d;
      pQVar4 = (range->br).d;
      (range->tl).d = local_98;
      (range->br).d = apQStack_90[0];
      local_98 = pQVar3;
      apQStack_90[0] = pQVar4;
    }
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_01);
  }
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::trimHiddenSelections(QItemSelectionRange *range) const
{
    Q_ASSERT(range && range->isValid());

    int top = range->top();
    int left = range->left();
    int bottom = range->bottom();
    int right = range->right();

    while (bottom >= top && verticalHeader->isSectionHidden(bottom))
        --bottom;
    while (right >= left && horizontalHeader->isSectionHidden(right))
        --right;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    while (verticalHeader->isSectionHidden(top) && top <= bottom)
        ++top;
    while (horizontalHeader->isSectionHidden(left) && left <= right)
        ++left;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    QModelIndex bottomRight = model->index(bottom, right, range->parent());
    QModelIndex topLeft = model->index(top, left, range->parent());
    *range = QItemSelectionRange(topLeft, bottomRight);
}